

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2805b::ChecksumOnlyFileSystem_basic_Test::TestBody
          (ChecksumOnlyFileSystem_basic_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> *this_00;
  FileSystem FVar2;
  int iVar3;
  SmallVectorImpl<char> *in_R8;
  char *pcVar4;
  char *in_R9;
  StringRef Suffix;
  StringRef Filename;
  StringRef Str;
  error_code ec;
  FileInfo ourFileInfo;
  FileInfo missingFileInfo;
  SmallString<256U> tempPath;
  undefined1 local_240 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  Child local_230;
  Child local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_210;
  AssertHelper local_208;
  ChecksumOnlyFileSystem local_200;
  __uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  local_1f0;
  string local_1e8;
  long local_1c8;
  long local_1c0;
  AssertHelper local_198;
  Child local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  uint local_138;
  undefined4 uStack_134;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [256];
  
  llbuild::basic::createLocalFileSystem();
  llbuild::basic::ChecksumOnlyFileSystem::from
            (&local_200,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_1f0);
  if (local_1f0._M_t.
      super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
      .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
       )0x0) {
    (**(code **)(*(long *)local_1f0._M_t.
                          super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
                          .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl +
                8))();
  }
  local_1f0._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
  .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl =
       (tuple<llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>)
       (_Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
        )0x0;
  local_138 = 0;
  uStack_134 = 0x100;
  local_140._M_head_impl = local_130;
  llvm::Twine::Twine((Twine *)&local_190,"FileSystemTests");
  Suffix.Length = (size_t)&local_140;
  Suffix.Data = (char *)0x3;
  llvm::sys::fs::createTemporaryFile((fs *)&local_190.character,(Twine *)0x195a15,Suffix,in_R8);
  local_230.twine = (Twine *)((ulong)(uint)local_230._4_4_ << 0x20);
  local_228.twine = (Twine *)std::_V2::system_category();
  Filename.Length._0_4_ = local_138;
  Filename.Data = (char *)local_140._M_head_impl;
  Filename.Length._4_4_ = 0;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&local_190,Filename,(error_code *)&local_230,F_Text);
  local_240[0] = (internal)(local_230.decUI == 0);
  local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_230.decUI != 0) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)local_240,(AssertionResult *)0x195e70,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xc9,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_210._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_210._M_head_impl + 8))();
    }
    if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_238,local_238);
    }
  }
  Str.Length = 0xd;
  Str.Data = "Hello, world!";
  iVar3 = 0x195817;
  llvm::raw_ostream::operator<<((raw_ostream *)&local_190,Str);
  llvm::raw_fd_ostream::close((raw_fd_ostream *)&local_190,iVar3);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_190);
  FVar2._vptr_FileSystem = local_200.super_FileSystem._vptr_FileSystem;
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"/does/not/exists","");
  (**(code **)(*FVar2._vptr_FileSystem + 0x38))(&local_190,FVar2._vptr_FileSystem,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((((local_190.twine == (Twine *)0x0) && (local_188 == 0)) && (local_180 == 0)) &&
     ((local_178 == 0 && (local_170 == 0)))) {
    local_230.character = local_168 == 0;
    local_228.twine = (Twine *)0x0;
    if (local_168 == 0) goto LAB_0011b22f;
  }
  else {
    local_230.twine = (Twine *)((ulong)(uint7)local_230._1_7_ << 8);
  }
  local_228.twine = (Twine *)0x0;
  testing::Message::Message((Message *)local_240);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_1e8,(internal *)&local_230.character,
             (AssertionResult *)"missingFileInfo.isMissing()","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_210,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
             ,0xcf,local_1e8._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)local_240);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_240 + 8))();
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_228.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_228.twine);
  }
LAB_0011b22f:
  FVar2._vptr_FileSystem = local_200.super_FileSystem._vptr_FileSystem;
  local_230.twine = (Twine *)&local_220;
  if (local_140._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_228.twine = (Twine *)0x0;
    local_220 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,local_140._M_head_impl,local_140._M_head_impl + local_138);
  }
  (**(code **)(*FVar2._vptr_FileSystem + 0x38))(&local_1e8,FVar2._vptr_FileSystem,&local_230);
  if (local_230.twine != (Twine *)&local_220) {
    operator_delete(local_230.twine,CONCAT71(uStack_21f,local_220) + 1);
  }
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (local_1e8._M_string_length == 0)) &&
     ((local_1e8.field_2._M_allocated_capacity == 0 &&
      ((local_1e8.field_2._8_8_ == 0 && (local_1c8 == 0)))))) {
    local_240[0] = (internal)(local_1c0 != 0);
    local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_1c0 == 0) {
      testing::Message::Message((Message *)&local_210);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_230,(internal *)local_240,
                 (AssertionResult *)"ourFileInfo.isMissing()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_208,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
                 ,0xd2,local_230.cString);
      testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_208);
      if (local_230.twine != (Twine *)&local_220) {
        operator_delete(local_230.twine,CONCAT71(uStack_21f,local_220) + 1);
      }
      if (local_210._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_210._M_head_impl + 8))();
      }
      if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_238,local_238);
      }
    }
  }
  local_240 = (undefined1  [8])0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long_long>
            ((internal *)&local_230.character,"ourFileInfo.device","0ull",
             (unsigned_long *)&local_1e8,(unsigned_long_long *)local_240);
  if (local_230.character == '\0') {
    testing::Message::Message((Message *)local_240);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228.twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_228.stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
    if (local_240 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_240 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_228.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_228.twine);
  }
  local_240 = (undefined1  [8])0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long_long>
            ((internal *)&local_230.character,"ourFileInfo.inode","0ull",&local_1e8._M_string_length
             ,(unsigned_long_long *)local_240);
  if (local_230.character == '\0') {
    testing::Message::Message((Message *)local_240);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228.twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_228.stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
    if (local_240 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_240 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_228.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_228.twine);
  }
  FVar2._vptr_FileSystem = local_200.super_FileSystem._vptr_FileSystem;
  local_230.twine = (Twine *)&local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"/does/not/exist","");
  (**(code **)(*FVar2._vptr_FileSystem + 0x20))(&local_210,FVar2._vptr_FileSystem,&local_230);
  if (local_230.twine != (Twine *)&local_220) {
    operator_delete(local_230.twine,CONCAT71(uStack_21f,local_220) + 1);
  }
  local_240 = (undefined1  [8])local_210._M_head_impl;
  local_208.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<llvm::MemoryBuffer*,decltype(nullptr)>
            ((internal *)&local_230.character,"missingFileContents.get()","nullptr",
             (MemoryBuffer **)local_240,&local_208.data_);
  if (local_230.character == '\0') {
    testing::Message::Message((Message *)local_240);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228.twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&(local_228.stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if (local_240 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_240 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_228.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_228.twine);
  }
  FVar2._vptr_FileSystem = local_200.super_FileSystem._vptr_FileSystem;
  if (local_140._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_228.twine = (Twine *)0x0;
    local_220 = 0;
    local_230.twine = (Twine *)&local_220;
  }
  else {
    local_230.twine = (Twine *)&local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,local_140._M_head_impl,local_140._M_head_impl + local_138);
  }
  (**(code **)(*FVar2._vptr_FileSystem + 0x20))(&local_208,FVar2._vptr_FileSystem,&local_230);
  if (local_230.twine != (Twine *)&local_220) {
    operator_delete(local_230.twine,CONCAT71(uStack_21f,local_220) + 1);
  }
  if ((local_208.data_)->file == (char *)0x0) {
    local_228.twine = (Twine *)0x0;
    local_220 = 0;
    local_230.twine = (Twine *)&local_220;
  }
  else {
    local_230.twine = (Twine *)&local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,(local_208.data_)->file,*(undefined8 *)&(local_208.data_)->line)
    ;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[14]>
            ((internal *)local_240,"ourFileContents->getBuffer().str()","\"Hello, world!\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
             (char (*) [14])"Hello, world!");
  if (local_230.twine != (Twine *)&local_220) {
    operator_delete(local_230.twine,CONCAT71(uStack_21f,local_220) + 1);
  }
  if (local_240[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_230);
    if (local_238 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_238->_M_dataplus)._M_p;
    }
    this_00 = &local_200.impl;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xdb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    if (local_230.twine != (Twine *)0x0) {
      (**(code **)(*local_230.decUL + 8))();
    }
  }
  if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_238,local_238);
  }
  local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_138;
  local_240 = (undefined1  [8])local_140._M_head_impl;
  llvm::Twine::Twine((Twine *)&local_230,(StringRef *)local_240);
  iVar3 = llvm::sys::fs::remove((fs *)&local_230.character,(char *)0x1);
  local_240[0] = (internal)(iVar3 == 0);
  local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar3 != 0) {
    testing::Message::Message((Message *)&local_200.impl);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_230,(internal *)local_240,(AssertionResult *)0x195e70,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xde,local_230.cString);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_200.impl);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_230.twine != (Twine *)&local_220) {
      operator_delete(local_230.twine,CONCAT71(uStack_21f,local_220) + 1);
    }
    if ((tuple<llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>)
        local_200.impl._M_t.
        super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
        ._M_t.
        super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
        .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl !=
        (_Head_base<0UL,_llbuild::basic::FileSystem_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_200.impl._M_t.
          super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
          ._M_t.
          super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
          .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl)[1])();
    }
    if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_238,local_238);
    }
  }
  if (local_208.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_208.data_ + 8))();
  }
  if (local_210._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_210._M_head_impl + 8))();
  }
  if (local_140._M_head_impl != local_130) {
    free(local_140._M_head_impl);
  }
  if (local_200.super_FileSystem._vptr_FileSystem != (_func_int **)0x0) {
    (**(code **)(*local_200.super_FileSystem._vptr_FileSystem + 8))();
  }
  return;
}

Assistant:

TEST(ChecksumOnlyFileSystem, basic) {
  // Check basic sanity of the local filesystem object.
  auto fs = ChecksumOnlyFileSystem::from(createLocalFileSystem());

  // Write a temp file.
  SmallString<256> tempPath;
  llvm::sys::fs::createTemporaryFile("FileSystemTests", "txt", tempPath);
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(tempPath.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  auto missingFileInfo = fs->getFileInfo("/does/not/exists");
  EXPECT_TRUE(missingFileInfo.isMissing());

  auto ourFileInfo = fs->getFileInfo(tempPath.str());
  EXPECT_FALSE(ourFileInfo.isMissing());

  EXPECT_EQ(ourFileInfo.device, 0ull);
  EXPECT_EQ(ourFileInfo.inode, 0ull);

  auto missingFileContents = fs->getFileContents("/does/not/exist");
  EXPECT_EQ(missingFileContents.get(), nullptr);

  auto ourFileContents = fs->getFileContents(tempPath.str());
  EXPECT_EQ(ourFileContents->getBuffer().str(), "Hello, world!");
  // Remove the temporary file.
  auto ec = llvm::sys::fs::remove(tempPath.str());
  EXPECT_FALSE(ec);
}